

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O1

void __thiscall cmFileTimeComparison::cmFileTimeComparison(cmFileTimeComparison *this)

{
  cmFileTimeComparisonInternal *pcVar1;
  
  pcVar1 = (cmFileTimeComparisonInternal *)operator_new(0x40);
  (pcVar1->Files)._M_h._M_buckets = &(pcVar1->Files)._M_h._M_single_bucket;
  (pcVar1->Files)._M_h._M_bucket_count = 1;
  (pcVar1->Files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pcVar1->Files)._M_h._M_element_count = 0;
  (pcVar1->Files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pcVar1->Files)._M_h._M_rehash_policy._M_next_resize = 0;
  (pcVar1->Files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->Internals = pcVar1;
  return;
}

Assistant:

cmFileTimeComparison::cmFileTimeComparison()
{
  this->Internals = new cmFileTimeComparisonInternal;
}